

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

bool __thiscall Json::Value::getString(Value *this,char **str,char **end)

{
  uint uVar1;
  uint *__s;
  bool bVar3;
  bool bVar4;
  size_t sVar2;
  
  bVar3 = (char)*(ushort *)&this->field_0x8 == '\x04';
  __s = (uint *)(this->value_).string_;
  bVar4 = __s != (uint *)0x0;
  if (bVar4 && bVar3) {
    if ((*(ushort *)&this->field_0x8 >> 8 & 1) == 0) {
      sVar2 = strlen((char *)__s);
      uVar1 = (uint)sVar2;
    }
    else {
      uVar1 = *__s;
      __s = __s + 1;
    }
    *str = (char *)__s;
    *end = (char *)((ulong)uVar1 + (long)__s);
  }
  return bVar4 && bVar3;
}

Assistant:

bool Value::getString(char const** str, char const** end) const {
  if (type_ != stringValue) return false;
  if (value_.string_ == 0) return false;
  unsigned length;
  decodePrefixedString(this->allocated_, this->value_.string_, &length, str);
  *end = *str + length;
  return true;
}